

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

char * __thiscall Potassco::ProgramOptions::Value::desc(Value *this,DescType t)

{
  byte bVar1;
  ValueDesc *pVVar2;
  
  bVar1 = this->descFlag_;
  if (bVar1 == 8 || bVar1 == t) {
    pVVar2 = &this->desc_;
    if (bVar1 != t) {
      pVVar2 = (ValueDesc *)((this->desc_).value + (long)((int)t >> 1) * 8);
    }
    return pVVar2->value;
  }
  return (char *)0x0;
}

Assistant:

const char* Value::desc(DescType t) const {
	if (descFlag_ == t || descFlag_ == desc_pack) {
		return descFlag_ == t
			? desc_.value
			: desc_.pack[t >> 1u];
	}
	return 0;
}